

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O2

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::CreateRawPegoutTransaction
          (ConfidentialTransactionController *__return_storage_ptr__,ElementsTransactionApi *this,
          uint32_t version,uint32_t locktime,
          vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *txins,
          vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
          *txouts,TxOutPegoutParameters *pegout_data,ConfidentialTxOut *txout_fee,
          Address *pegout_address)

{
  bool bVar1;
  ConfidentialTransactionController *this_00;
  Amount AVar2;
  allocator local_5f1;
  ConfidentialTransactionController *local_5f0;
  undefined1 local_5e8 [24];
  undefined1 local_5d0 [40];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_5a8;
  Address dummy_addr;
  ConfidentialTxOut empty_fee;
  ConfidentialTxOutReference local_318;
  ConfidentialTxOutReference local_220;
  ConfidentialTxOutReference local_128;
  
  core::ConfidentialTxOut::ConfidentialTxOut(&empty_fee);
  local_5f0 = __return_storage_ptr__;
  CreateRawTransaction(__return_storage_ptr__,this,version,locktime,txins,txouts,&empty_fee);
  this_00 = local_5f0;
  bVar1 = core::Pubkey::IsValid(&pegout_data->online_pubkey);
  if (bVar1) {
    bVar1 = core::Privkey::IsInvalid((Privkey *)&pegout_data->master_online_key);
    if (!bVar1) {
      core::Address::Address(&dummy_addr);
      ConfidentialTransactionController::AddPegoutTxOut
                (&local_128,local_5f0,&pegout_data->amount,&pegout_data->asset,
                 &pegout_data->genesisblock_hash,&dummy_addr,pegout_data->net_type,
                 &pegout_data->online_pubkey,(Privkey *)&pegout_data->master_online_key,
                 &pegout_data->bitcoin_descriptor,pegout_data->bip32_counter,&pegout_data->whitelist
                 ,pegout_data->elements_net_type,pegout_address);
      core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_128);
      core::Address::~Address(&dummy_addr);
      this_00 = local_5f0;
      goto LAB_0035ec40;
    }
  }
  core::Pubkey::Pubkey((Pubkey *)local_5e8);
  core::Privkey::Privkey((Privkey *)&dummy_addr);
  std::__cxx11::string::string((string *)local_5d0,"",&local_5f1);
  core::ByteData::ByteData((ByteData *)&local_5a8);
  ConfidentialTransactionController::AddPegoutTxOut
            (&local_220,this_00,&pegout_data->amount,&pegout_data->asset,
             &pegout_data->genesisblock_hash,&pegout_data->btc_address,kMainnet,(Pubkey *)local_5e8,
             (Privkey *)&dummy_addr,(string *)local_5d0,0,(ByteData *)&local_5a8,kLiquidV1,
             (Address *)0x0);
  core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_220);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_5a8);
  std::__cxx11::string::~string((string *)local_5d0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dummy_addr);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_5e8);
LAB_0035ec40:
  core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&dummy_addr,&txout_fee->confidential_value_);
  AVar2 = core::ConfidentialValue::GetAmount((ConfidentialValue *)&dummy_addr);
  local_5d0._0_8_ = AVar2.amount_;
  local_5d0[8] = AVar2.ignore_check_;
  bVar1 = core::Amount::operator!=((Amount *)local_5d0,0);
  core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&dummy_addr);
  if (bVar1) {
    core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&dummy_addr,&txout_fee->confidential_value_);
    AVar2 = core::ConfidentialValue::GetAmount((ConfidentialValue *)&dummy_addr);
    local_5e8._0_8_ = AVar2.amount_;
    local_5e8[8] = AVar2.ignore_check_;
    core::ConfidentialAssetId::ConfidentialAssetId
              ((ConfidentialAssetId *)local_5d0,&txout_fee->asset_);
    ConfidentialTransactionController::AddTxOutFee
              (&local_318,this_00,(Amount *)local_5e8,(ConfidentialAssetId *)local_5d0);
    core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_318);
    core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)local_5d0);
    core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&dummy_addr);
  }
  core::ConfidentialTxOut::~ConfidentialTxOut(&empty_fee);
  return this_00;
}

Assistant:

ConfidentialTransactionController
ElementsTransactionApi::CreateRawPegoutTransaction(
    uint32_t version, uint32_t locktime,
    const std::vector<ConfidentialTxIn>& txins,
    const std::vector<ConfidentialTxOut>& txouts,
    const TxOutPegoutParameters& pegout_data,
    const ConfidentialTxOut& txout_fee, Address* pegout_address) const {
  ConfidentialTxOut empty_fee;
  ConfidentialTransactionController ctxc =
      CreateRawTransaction(version, locktime, txins, txouts, empty_fee);

  if (pegout_data.online_pubkey.IsValid() &&
      !pegout_data.master_online_key.IsInvalid()) {
    Address dummy_addr;
    ctxc.AddPegoutTxOut(
        pegout_data.amount, pegout_data.asset, pegout_data.genesisblock_hash,
        dummy_addr, pegout_data.net_type, pegout_data.online_pubkey,
        pegout_data.master_online_key, pegout_data.bitcoin_descriptor,
        pegout_data.bip32_counter, pegout_data.whitelist,
        pegout_data.elements_net_type, pegout_address);
  } else {
    ctxc.AddPegoutTxOut(
        pegout_data.amount, pegout_data.asset, pegout_data.genesisblock_hash,
        pegout_data.btc_address);
  }

  // A fee with an amount of 0 is considered invalid.
  if (txout_fee.GetConfidentialValue().GetAmount() != 0) {
    ctxc.AddTxOutFee(
        txout_fee.GetConfidentialValue().GetAmount(), txout_fee.GetAsset());
  }

  return ctxc;
}